

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O0

void __thiscall mp::SPAdapter::SPAdapter(SPAdapter *this,ColProblem *p)

{
  StringRef name;
  bool bVar1;
  int iVar2;
  char *__s1;
  SafeBool SVar3;
  size_type sVar4;
  reference pvVar5;
  ColProblem *in_RSI;
  Problem *in_RDI;
  SPAdapter *unaff_retaddr;
  SPAdapter *in_stack_000000a0;
  SPAdapter *in_stack_000000c0;
  int core_var_index;
  int stage;
  int i_2;
  int i_1;
  vector<int,_std::allocator<int>_> stage_offsets;
  int num_vars;
  IntSuffix stage_suffix;
  Function function;
  int n;
  int i;
  undefined4 in_stack_fffffffffffffe88;
  int iVar6;
  Kind in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  value_type vVar7;
  int in_stack_fffffffffffffe94;
  BasicExprFactory<std::allocator<char>_> *in_stack_fffffffffffffe98;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffea0;
  allocator_type *__a;
  SPAdapter *in_stack_fffffffffffffea8;
  SuffixBase in_stack_fffffffffffffeb0;
  vector<int,_std::allocator<int>_> *this_00;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  SPAdapter *this_01;
  int local_84;
  int local_80;
  allocator_type local_79;
  vector<int,_std::allocator<int>_> local_78;
  int local_60;
  Impl *local_58;
  SuffixBase local_40;
  Function local_38;
  int local_2c;
  int local_28;
  allocator<char> local_11 [9];
  Problem *p_00;
  
  (in_RDI->super_ExprFactory)._vptr_BasicExprFactory = (_func_int **)in_RSI;
  this_01 = (SPAdapter *)&(in_RDI->super_ExprFactory).exprs_;
  p_00 = in_RDI;
  std::allocator<char>::allocator();
  BasicExprFactory<std::allocator<char>_>::BasicExprFactory
            ((BasicExprFactory<std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::allocator<char>::~allocator(local_11);
  Function::Function((Function *)(in_RDI->super_SuffixManager).suffixes_);
  SparseMatrix<double>::SparseMatrix
            ((SparseMatrix<double> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c9071);
  SparseMatrix<double>::SparseMatrix
            ((SparseMatrix<double> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  std::vector<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>::vector
            ((vector<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_> *)
             0x1c90a8);
  std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>::vector
            ((vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_> *)
             0x1c90c1);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1c90dd);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1c90f9);
  *(int *)&(in_RDI->obj_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start = 1;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1c911f);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1c913b);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1c9157);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1c9173);
  LinearExpr::LinearExpr((LinearExpr *)0x1c918f);
  std::
  vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ::vector((vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
            *)0x1c91aa);
  local_28 = 0;
  local_2c = BasicExprFactory<std::allocator<char>_>::num_functions
                       ((BasicExprFactory<std::allocator<char>_> *)0x1c91c2);
  do {
    if (local_2c <= local_28) {
LAB_001c92f8:
      GetRandomVectors(unaff_retaddr,p_00);
      SuffixManager::suffixes
                ((SuffixManager *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 in_stack_fffffffffffffe8c);
      fmt::BasicStringRef<char>::BasicStringRef
                ((BasicStringRef<char> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      name.size_._0_4_ = in_stack_fffffffffffffeb8;
      name.data_ = (char *)in_stack_fffffffffffffeb0.impl_;
      name.size_._4_4_ = in_stack_fffffffffffffebc;
      local_40.impl_ =
           (Impl *)BasicSuffixSet<std::allocator<char>_>::Find<int>
                             ((BasicSuffixSet<std::allocator<char>_> *)in_stack_fffffffffffffea8,
                              name);
      SVar3 = internal::SuffixBase::operator_cast_to_function_pointer(&local_40);
      if (SVar3 == 0) {
        GetVarStages<mp::(anonymous_namespace)::NullSuffix>((SPAdapter *)in_RDI);
      }
      else {
        local_58 = local_40.impl_;
        GetVarStages<mp::BasicSuffix<int>>
                  (in_stack_fffffffffffffea8,(BasicSuffix<int>)in_stack_fffffffffffffeb0.impl_);
      }
      bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_stack_fffffffffffffea0);
      if (bVar1) {
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0.impl_,
                   (size_type)in_stack_fffffffffffffea8);
      }
      sVar4 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)
                         &(in_RDI->obj_names_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      *(int *)&(in_RDI->obj_names_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start = (int)sVar4;
      local_60 = BasicProblem<mp::BasicProblemParams<int>_>::num_vars
                           ((BasicProblem<mp::BasicProblemParams<int>_> *)0x1c942f);
      this_00 = (vector<int,_std::allocator<int>_> *)&in_RDI->var_names_;
      sVar4 = (size_type)local_60;
      std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>::size
                ((vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
                  *)((long)&(in_RDI->super_SuffixManager).suffixes_[3].set_._M_t._M_impl.
                            super__Rb_tree_header._M_header + 0x10));
      std::vector<int,_std::allocator<int>_>::resize(this_00,sVar4);
      __a = &local_79;
      std::allocator<int>::allocator((allocator<int> *)0x1c94a9);
      std::vector<int,_std::allocator<int>_>::vector(this_00,sVar4,__a);
      std::allocator<int>::~allocator((allocator<int> *)0x1c94cf);
      for (local_80 = 1;
          local_80 <
          *(int *)&(in_RDI->obj_names_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; local_80 = local_80 + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)(local_80 + -1))
        ;
        vVar7 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &(in_RDI->obj_names_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(long)(local_80 + -1));
        iVar2 = vVar7 + *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)local_80);
        *pvVar5 = iVar2;
      }
      for (local_84 = 0; local_84 < local_60; local_84 = local_84 + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&in_RDI->con_names_,(long)local_84)
        ;
        if (-1 < *pvVar5) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)*pvVar5);
          iVar2 = *pvVar5;
          *pvVar5 = iVar2 + 1;
          iVar6 = local_84;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&in_RDI->var_names_,(long)iVar2);
          *pvVar5 = iVar6;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&in_RDI->con_names_,
                              (long)local_84);
          *pvVar5 = iVar2;
        }
      }
      ProcessObjs(in_stack_000000c0);
      ProcessCons(this_01);
      if (1 < *(int *)&(in_RDI->obj_names_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) {
        ExtractRandomTerms(in_stack_000000a0);
      }
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
      return;
    }
    local_38 = BasicExprFactory<std::allocator<char>_>::function
                         (in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
    __s1 = Function::name(&local_38);
    iVar2 = strcmp(__s1,"random");
    if (iVar2 == 0) {
      (in_RDI->super_SuffixManager).suffixes_[0]._vptr_BasicSuffixSet = (_func_int **)local_38.impl_
      ;
      goto LAB_001c92f8;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

SPAdapter::SPAdapter(const ColProblem &p): problem_(p), num_stages_(1) {
  // Find the random function.
  for (int i = 0, n = p.num_functions(); i < n; ++i) {
    auto function = p.function(i);
    if (std::strcmp(function.name(), "random") == 0) {
      random_ = function;
      break;
    }
  }

  GetRandomVectors(p);

  // Reorder variables by stages.
  if (IntSuffix stage_suffix = p.suffixes(suf::VAR).Find<int>("stage"))
    GetVarStages(stage_suffix);
  else
    GetVarStages(NullSuffix());
  if (num_stage_vars_.empty())
    num_stage_vars_.resize(1);
  num_stages_ = static_cast<int>(num_stage_vars_.size());
  int num_vars = p.num_vars();
  var_core2orig_.resize(num_vars - random_vars_.size());
  std::vector<int> stage_offsets(num_stages_);
  for (int i = 1; i < num_stages_; ++i)
    stage_offsets[i] = stage_offsets[i - 1] + num_stage_vars_[i - 1];
  for (int i = 0; i < num_vars; ++i) {
    int stage = var_orig2core_[i];
    if (stage < 0)
      continue;  // Skip random variables.
    int core_var_index = stage_offsets[stage]++;
    var_core2orig_[core_var_index] = i;
    var_orig2core_[i] = core_var_index;
  }

  ProcessObjs();
  ProcessCons();
  if (num_stages_ > 1)
    ExtractRandomTerms();
}